

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O2

uint64_t jbcoin::getRate(STAmount *offerOut,STAmount *offerIn)

{
  Issue *issue;
  STAmount r;
  STAmount SStack_58;
  
  if (offerOut->mValue != 0) {
    issue = noIssue();
    divide(&SStack_58,offerIn,offerOut,issue);
    if (SStack_58.mValue != 0) {
      if (SStack_58.mOffset + 100U < 0x100) {
        return (ulong)(SStack_58.mOffset + 100U) << 0x38 | SStack_58.mValue;
      }
      __assert_fail("(r.exponent() >= -100) && (r.exponent() <= 155)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STAmount.cpp"
                    ,0x1b3,"std::uint64_t jbcoin::getRate(const STAmount &, const STAmount &)");
    }
  }
  return 0;
}

Assistant:

STAmount::STAmount (Issue const& issue,
        mantissa_type mantissa, exponent_type exponent,
            bool native, bool negative, unchecked)
    : mIssue (issue)
    , mValue (mantissa)
    , mOffset (exponent)
    , mIsNative (native)
    , mIsNegative (negative)
{
}